

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_adpcm.cpp
# Opt level: O2

void __thiscall
ymfm::adpcm_b_channel::output<2>(adpcm_b_channel *this,ymfm_output<2> *output,uint32_t rshift)

{
  adpcm_b_registers *paVar1;
  int iVar2;
  byte bVar3;
  
  paVar1 = this->m_regs;
  iVar2 = (int)((uint)paVar1->m_regdata[0xb] *
               ((int)(this->m_position * this->m_accumulator +
                     ((this->m_position ^ 0xffff) + 1) * this->m_prev_accum) >> 0x10)) >>
          ((char)rshift + 8U & 0x1f);
  bVar3 = paVar1->m_regdata[1];
  if ((char)bVar3 < '\0') {
    output->data[0] = output->data[0] + iVar2;
    bVar3 = paVar1->m_regdata[1];
  }
  if ((bVar3 & 0x40) != 0) {
    output->data[1] = output->data[1] + iVar2;
  }
  return;
}

Assistant:

void adpcm_b_channel::output(ymfm_output<NumOutputs> &output, uint32_t rshift) const
{
	// mask out some channels for debug purposes
	if ((debug::GLOBAL_ADPCM_B_CHANNEL_MASK & 1) == 0)
		return;

	// do a linear interpolation between samples
	int32_t result = (m_prev_accum * int32_t((m_position ^ 0xffff) + 1) + m_accumulator * int32_t(m_position)) >> 16;

	// apply volume (level) in a linear fashion and reduce
	result = (result * int32_t(m_regs.level())) >> (8 + rshift);

	// apply to left/right
	if (NumOutputs == 1 || m_regs.pan_left())
		output.data[0] += result;
	if (NumOutputs > 1 && m_regs.pan_right())
		output.data[1] += result;
}